

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trip.c
# Opt level: O3

void read_trip(trip_t *record,int field_count,char **field_names,char **field_values)

{
  int iVar1;
  bikes_allowed_t bVar2;
  wheelchair_accessible_t wVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  trip_t *__dest;
  
  record->route_id[0] = '\0';
  record->service_id[0] = '\0';
  record->id[0] = '\0';
  record->headsign[0] = '\0';
  record->short_name[0] = '\0';
  record->direction_id = 0;
  record->block_id[0] = '\0';
  record->shape_id[0] = '\0';
  record->wheelchair_accessible = WA_UNKNOWN;
  record->bikes_allowed = BA_UNKNOWN;
  if (0 < field_count) {
    uVar5 = 0;
    do {
      pcVar6 = field_names[uVar5];
      iVar1 = strcmp(pcVar6,"route_id");
      if (iVar1 == 0) {
        pcVar6 = field_values[uVar5];
        __dest = record;
LAB_00106c45:
        strcpy(__dest->route_id,pcVar6);
      }
      else {
        iVar1 = strcmp(pcVar6,"service_id");
        if (iVar1 == 0) {
          pcVar6 = field_values[uVar5];
          __dest = (trip_t *)record->service_id;
          goto LAB_00106c45;
        }
        iVar1 = strcmp(pcVar6,"trip_id");
        if (iVar1 == 0) {
          pcVar6 = field_values[uVar5];
          __dest = (trip_t *)record->id;
          goto LAB_00106c45;
        }
        iVar1 = strcmp(pcVar6,"trip_headsign");
        if (iVar1 == 0) {
          pcVar6 = field_values[uVar5];
          __dest = (trip_t *)record->headsign;
          goto LAB_00106c45;
        }
        iVar1 = strcmp(pcVar6,"trip_short_name");
        if (iVar1 == 0) {
          pcVar6 = field_values[uVar5];
          __dest = (trip_t *)record->short_name;
          goto LAB_00106c45;
        }
        iVar1 = strcmp(pcVar6,"direction_id");
        if (iVar1 != 0) {
          iVar1 = strcmp(pcVar6,"block_id");
          if (iVar1 == 0) {
            pcVar6 = field_values[uVar5];
            __dest = (trip_t *)record->block_id;
          }
          else {
            iVar1 = strcmp(pcVar6,"shape_id");
            if (iVar1 != 0) {
              iVar1 = strcmp(pcVar6,"wheelchair_accessible");
              if (iVar1 == 0) {
                wVar3 = parse_wheelchair_accessibility(field_values[uVar5]);
                record->wheelchair_accessible = wVar3;
              }
              else {
                iVar1 = strcmp(pcVar6,"bikes_allowed");
                if (iVar1 == 0) {
                  bVar2 = parse_bike_allowance(field_values[uVar5]);
                  record->bikes_allowed = bVar2;
                }
              }
              goto LAB_00106c4a;
            }
            pcVar6 = field_values[uVar5];
            __dest = (trip_t *)record->shape_id;
          }
          goto LAB_00106c45;
        }
        uVar4 = strtoul(field_values[uVar5],(char **)0x0,0);
        record->direction_id = (uint)uVar4;
      }
LAB_00106c4a:
      uVar5 = uVar5 + 1;
    } while ((uint)field_count != uVar5);
  }
  return;
}

Assistant:

void read_trip(trip_t *record, int field_count, const char **field_names, const char **field_values) {
    init_trip(record);

    for (int i = 0; i < field_count; i++) {
        if (strcmp(field_names[i], "route_id") == 0) {
            strcpy(record->route_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "service_id") == 0) {
            strcpy(record->service_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "trip_id") == 0) {
            strcpy(record->id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "trip_headsign") == 0) {
            strcpy(record->headsign, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "trip_short_name") == 0) {
            strcpy(record->short_name, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "direction_id") == 0) {
            record->direction_id = (unsigned int)strtoul(field_values[i], NULL, 0);
            continue;
        }
        if (strcmp(field_names[i], "block_id") == 0) {
            strcpy(record->block_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "shape_id") == 0) {
            strcpy(record->shape_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "wheelchair_accessible") == 0) {
            record->wheelchair_accessible = parse_wheelchair_accessibility(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "bikes_allowed") == 0) {
            record->bikes_allowed = parse_bike_allowance(field_values[i]);
            continue;
        }
    }
}